

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::handleAssign
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,TIntermTyped *left,
          TIntermTyped *right)

{
  TOperator TVar1;
  _func_int **pp_Var2;
  TIntermSymbol *pTVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermTyped *pTVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TTypeList *pTVar12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  iterator iVar13;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar14;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long *plVar15;
  longlong lVar16;
  TVariable *pTVar17;
  TIntermSymbol *pTVar18;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TIntermSymbol *pTVar19;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  TIntermAggregate *pTVar20;
  undefined4 extraout_var_22;
  TIntermediate *pTVar21;
  TQualifier *this_00;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  TIntermConstantUnion *index;
  TSourceLoc *pTVar22;
  bool isSplitLeft;
  bool isSplitRight;
  bool isFlattenRight;
  bool isFlattenLeft;
  TIntermediate *local_1d8;
  TSourceLoc *local_1d0;
  TIntermSymbol *local_1c8;
  TOperator local_1bc;
  TIntermSymbol *local_1b8;
  TIntermAggregate *assignList;
  anon_class_8_1_8991fb9c indexesSplit;
  TStorageQualifier rightStorage;
  TStorageQualifier leftStorage;
  TOperator op_local;
  TVector<glslang::TVariable_*> *rightVariables;
  TVector<glslang::TVariable_*> *leftVariables;
  anon_class_8_1_8991fb9c assignsClipPos;
  int rightOffset;
  int leftOffset;
  int rightOffsetStart;
  int leftOffsetStart;
  vector<int,_std::allocator<int>_> arrayElement;
  anon_class_104_13_1d5e7770 getMember;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  TType derefType;
  
  if (right == (TIntermTyped *)0x0 || left == (TIntermTyped *)0x0) {
    return (TIntermTyped *)0x0;
  }
  pTVar11 = (TIntermTyped *)loc;
  op_local = op;
  iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x1b0))
                    ((long *)CONCAT44(extraout_var,iVar9));
  if (cVar4 != '\0') {
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->needToLegalize = true;
  }
  iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])(left);
  if ((CONCAT44(extraout_var_00,iVar9) != 0) &&
     (iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])(left),
     *(int *)(CONCAT44(extraout_var_01,iVar9) + 0xb8) == 0x2d7)) {
    pTVar11 = handleAssignToMatrixSwizzle(this,loc,op,left,right);
    return pTVar11;
  }
  local_1d0 = loc;
  indexesSplit.this = this;
  assignsClipPos.this = this;
  local_1c8 = handleAssign::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)left,pTVar11);
  local_1d8 = (TIntermediate *)
              handleAssign::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)right,pTVar11);
  bVar5 = wasSplit(this,left);
  bVar7 = true;
  bVar6 = true;
  if (!bVar5) {
    bVar6 = handleAssign::anon_class_8_1_8991fb9c::operator()(&indexesSplit,left);
  }
  isSplitLeft = bVar6;
  local_1bc = op;
  bVar5 = wasSplit(this,right);
  if (!bVar5) {
    bVar7 = handleAssign::anon_class_8_1_8991fb9c::operator()(&indexesSplit,right);
  }
  isSplitRight = bVar7;
  local_1b8 = (TIntermSymbol *)right;
  bVar5 = wasFlattened(this,&local_1c8->super_TIntermTyped);
  isFlattenLeft = bVar5;
  bVar8 = wasFlattened(this,(TIntermTyped *)local_1d8);
  isFlattenRight = bVar8;
  if (((!bVar8 && !bVar5) && (bVar6 == false)) && (bVar7 == false)) {
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    bVar5 = isClipOrCullDistance((TType *)CONCAT44(extraout_var_18,iVar9));
    pTVar3 = local_1b8;
    if (!bVar5) {
      iVar9 = (*(local_1b8->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                        (local_1b8);
      bVar5 = isClipOrCullDistance((TType *)CONCAT44(extraout_var_19,iVar9));
      if (!bVar5) {
        bVar5 = handleAssign::anon_class_8_1_8991fb9c::operator()(&assignsClipPos,left);
        TVar1 = local_1bc;
        pTVar22 = local_1d0;
        if (bVar5) {
          pTVar11 = assignPosition(this,local_1d0,local_1bc,left,&pTVar3->super_TIntermTyped);
          return pTVar11;
        }
        iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x21])(left);
        if ((((*(uint *)(CONCAT44(extraout_var_23,iVar9) + 8) & 0xff80) == 0x2380) &&
            (iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x2a])(left), (char)iVar9 != '\0'
            )) && (iVar9 = (*(pTVar3->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x2a])
                                     (pTVar3), (char)iVar9 == '\0')) {
          iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
          TType::TType(&derefType,(TType *)CONCAT44(extraout_var_24,iVar9),0,false);
          pTVar21 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          index = TIntermediate::addConstantUnion(pTVar21,0,local_1d0,false);
          left = TIntermediate::addIndex
                           (pTVar21,EOpIndexDirect,left,&index->super_TIntermTyped,local_1d0);
          pTVar22 = local_1d0;
          (*(left->super_TIntermNode)._vptr_TIntermNode[0x1d])(left,&derefType);
        }
        pTVar11 = TIntermediate::addAssign
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,TVar1
                             ,left,&pTVar3->super_TIntermTyped,pTVar22);
        return pTVar11;
      }
    }
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    bVar5 = isClipOrCullDistance((TType *)CONCAT44(extraout_var_20,iVar9));
    pTVar19 = pTVar3;
    if (bVar5) {
      pTVar19 = (TIntermSymbol *)left;
    }
    iVar9 = (*(pTVar19->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar9) + 0x58))
                       ((long *)CONCAT44(extraout_var_21,iVar9));
    pTVar20 = assignClipCullDistance
                        (this,local_1d0,local_1bc,*(uint *)(lVar14 + 0x1c) & 0xfff,left,
                         &pTVar3->super_TIntermTyped);
    return (TIntermTyped *)pTVar20;
  }
  assignList = (TIntermAggregate *)0x0;
  leftVariables = (TVector<glslang::TVariable_*> *)0x0;
  rightVariables = (TVector<glslang::TVariable_*> *)0x0;
  iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar9) + 0x128))
                    ((long *)CONCAT44(extraout_var_02,iVar9));
  iVar9 = 0;
  if (cVar4 != '\0') {
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    pTVar12 = TType::getStruct((TType *)CONCAT44(extraout_var_03,iVar9));
    iVar9 = (int)((ulong)((long)(pTVar12->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar12->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ).
                               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
  }
  iVar10 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar10) + 0xe8))
                    ((long *)CONCAT44(extraout_var_04,iVar10));
  if (cVar4 != '\0') {
    iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar9) + 0x88))
                      ((long *)CONCAT44(extraout_var_05,iVar9));
  }
  if (bVar5) {
    iVar10 = (*(local_1c8->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
    derefType._vptr_TType = (_func_int **)CONCAT44(extraout_var_06,iVar10);
    iVar13 = std::
             _Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
             ::find((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                     *)&this->flattenMap,(key_type_conflict2 *)&derefType);
    leftVariables = (TVector<glslang::TVariable_*> *)&iVar13._M_node[1]._M_parent;
  }
  pTVar3 = local_1b8;
  if (bVar8) {
    iVar9 = (*(((TIntermTyped *)&local_1d8->language)->super_TIntermNode)._vptr_TIntermNode[0x30])()
    ;
    derefType._vptr_TType = (_func_int **)CONCAT44(extraout_var_07,iVar9);
    iVar13 = std::
             _Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
             ::find((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                     *)&this->flattenMap,(key_type_conflict2 *)&derefType);
    rightVariables = (TVector<glslang::TVariable_*> *)&iVar13._M_node[1]._M_parent;
  }
  else if (1 < iVar9) {
    iVar9 = (*(local_1b8->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(local_1b8);
    pp_Var2 = (pTVar3->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
    if (CONCAT44(extraout_var_14,iVar9) == 0) {
      iVar9 = (*pp_Var2[0x1e])(pTVar3);
      pTVar21 = (TIntermediate *)
                makeInternalVariable(this,"flattenTemp",(TType *)CONCAT44(extraout_var_22,iVar9));
      plVar15 = (long *)(**(code **)(*(long *)pTVar21 + 0x68))(pTVar21);
      this_00 = (TQualifier *)(**(code **)(*plVar15 + 0x50))(plVar15);
      TQualifier::makeTemporary(this_00);
      pTVar22 = local_1d0;
      local_1d8 = pTVar21;
      pTVar19 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           (TVariable *)pTVar21,local_1d0);
      pTVar21 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar11 = TIntermediate::addAssign
                          (pTVar21,local_1bc,&pTVar19->super_TIntermTyped,
                           &pTVar3->super_TIntermTyped,pTVar22);
      local_1c8 = (TIntermSymbol *)0x0;
      assignList = TIntermediate::growAggregate
                             (pTVar21,(TIntermNode *)0x0,&pTVar11->super_TIntermNode,pTVar22);
    }
    else {
      iVar9 = (*pp_Var2[0xc])();
      local_1c8 = (TIntermSymbol *)CONCAT44(extraout_var_15,iVar9);
      local_1d8 = (TIntermediate *)0x0;
    }
    goto LAB_00316b42;
  }
  local_1d8 = (TIntermediate *)0x0;
  local_1c8 = (TIntermSymbol *)0x0;
LAB_00316b42:
  arrayElement.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arrayElement.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  arrayElement.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar9) + 0x58))
                     ((long *)CONCAT44(extraout_var_08,iVar9));
  leftStorage = *(TStorageQualifier *)(lVar14 + 8) & 0x7f;
  iVar9 = (*(pTVar3->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar3);
  lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar9) + 0x58))
                     ((long *)CONCAT44(extraout_var_09,iVar9));
  rightStorage = *(TStorageQualifier *)(lVar14 + 8) & 0x7f;
  iVar9 = findSubtreeOffset(this,&left->super_TIntermNode);
  leftOffsetStart = iVar9;
  rightOffset = findSubtreeOffset(this,(TIntermNode *)pTVar3);
  pTVar22 = local_1d0;
  getMember.rightOffsetStart = &rightOffsetStart;
  getMember.leftOffset = &leftOffset;
  getMember.rightOffset = &rightOffset;
  getMember.isSplitLeft = &isSplitLeft;
  getMember.arrayElement = &arrayElement;
  getMember.loc = local_1d0;
  getMember.leftVariables = &leftVariables;
  getMember.rightVariables = &rightVariables;
  leftOffset = iVar9;
  rightOffsetStart = rightOffset;
  getMember.isSplitRight = &isSplitRight;
  getMember.this = this;
  getMember.leftStorage = &leftStorage;
  getMember.rightStorage = &rightStorage;
  getMember.leftOffsetStart = &leftOffsetStart;
  if (local_1d8 == (TIntermediate *)0x0) {
    if (local_1c8 != (TIntermSymbol *)0x0) {
      local_1b8 = TIntermediate::addSymbol
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             local_1c8);
    }
  }
  else {
    local_1b8 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           (TVariable *)local_1d8,local_1d0);
  }
  local_e8._8_8_ = 0;
  local_e8._M_unused._M_object = ::operator_new(0x70);
  pTVar3 = local_1b8;
  *(bool **)local_e8._M_unused._0_8_ = &isFlattenLeft;
  *(HlslParseContext **)((long)local_e8._M_unused._0_8_ + 8) = this;
  *(TStorageQualifier **)((long)local_e8._M_unused._0_8_ + 0x10) = &leftStorage;
  *(bool **)((long)local_e8._M_unused._0_8_ + 0x18) = &isFlattenRight;
  *(TStorageQualifier **)((long)local_e8._M_unused._0_8_ + 0x20) = &rightStorage;
  *(bool **)((long)local_e8._M_unused._0_8_ + 0x28) = &isSplitLeft;
  *(bool **)((long)local_e8._M_unused._0_8_ + 0x30) = &isSplitRight;
  *(vector<int,_std::allocator<int>_> **)((long)local_e8._M_unused._0_8_ + 0x38) = &arrayElement;
  *(anon_class_104_13_1d5e7770 **)((long)local_e8._M_unused._0_8_ + 0x40) = &getMember;
  *(_Any_data **)((long)local_e8._M_unused._0_8_ + 0x48) = &local_e8;
  *(TIntermAggregate ***)((long)local_e8._M_unused._0_8_ + 0x50) = &assignList;
  *(TOperator **)((long)local_e8._M_unused._0_8_ + 0x58) = &op_local;
  *(TSourceLoc **)((long)local_e8._M_unused._0_8_ + 0x60) = pTVar22;
  *(anon_class_8_1_8991fb9c **)((long)local_e8._M_unused._0_8_ + 0x68) = &assignsClipPos;
  local_d0 = std::
             _Function_handler<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:3072:16)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:3072:16)>
             ::_M_manager;
  pTVar19 = (TIntermSymbol *)left;
  if (isSplitLeft == true) {
    bVar5 = handleAssign::anon_class_8_1_8991fb9c::operator()(&indexesSplit,left);
    pp_Var2 = (left->super_TIntermNode)._vptr_TIntermNode;
    if (bVar5) {
      iVar9 = (*pp_Var2[8])();
      plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar9) + 400))
                                  ((long *)CONCAT44(extraout_var_10,iVar9));
      plVar15 = (long *)(**(code **)(*plVar15 + 0x60))(plVar15);
      pTVar21 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      lVar16 = (**(code **)(*plVar15 + 0x180))(plVar15);
      pTVar17 = getSplitNonIoVar(this,lVar16);
      pTVar22 = local_1d0;
      pTVar18 = TIntermediate::addSymbol(pTVar21,pTVar17,local_1d0);
      local_1d8 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])(left);
      TVar1 = *(TOperator *)(CONCAT44(extraout_var_11,iVar9) + 0xb8);
      iVar9 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])(left);
      pTVar11 = (TIntermTyped *)
                (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar9) + 0x198))
                          ((long *)CONCAT44(extraout_var_12,iVar9));
      pTVar19 = (TIntermSymbol *)
                TIntermediate::addIndex
                          (local_1d8,TVar1,&pTVar18->super_TIntermTyped,pTVar11,pTVar22);
      iVar9 = (*(pTVar18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar18);
      TType::TType(&derefType,(TType *)CONCAT44(extraout_var_13,iVar9),0,false);
      (*(pTVar19->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])(pTVar19,&derefType)
      ;
    }
    else {
      iVar9 = (*pp_Var2[0xc])(left);
      pTVar21 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      lVar16 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar9) + 0x180))
                         ((long *)CONCAT44(extraout_var_16,iVar9));
      pTVar17 = getSplitNonIoVar(this,lVar16);
      pTVar22 = local_1d0;
      pTVar19 = TIntermediate::addSymbol(pTVar21,pTVar17,local_1d0);
    }
  }
  pTVar18 = pTVar3;
  if (isSplitRight == true) {
    pTVar21 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar9 = (*(pTVar3->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(pTVar3);
    lVar16 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar9) + 0x180))
                       ((long *)CONCAT44(extraout_var_17,iVar9));
    pTVar17 = getSplitNonIoVar(this,lVar16);
    pTVar18 = TIntermediate::addSymbol(pTVar21,pTVar17,pTVar22);
  }
  std::
  function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
  ::operator()((function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
                *)&local_e8,left,&pTVar3->super_TIntermTyped,&pTVar19->super_TIntermTyped,
               &pTVar18->super_TIntermTyped,true);
  if (assignList != (TIntermAggregate *)0x0) {
    (*(assignList->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
      [0x31])(assignList,1);
    pTVar20 = assignList;
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&arrayElement.super__Vector_base<int,_std::allocator<int>_>);
    return (TIntermTyped *)pTVar20;
  }
  __assert_fail("assignList != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                ,0xc98,
                "TIntermTyped *glslang::HlslParseContext::handleAssign(const TSourceLoc &, TOperator, TIntermTyped *, TIntermTyped *)"
               );
}

Assistant:

TIntermTyped* HlslParseContext::handleAssign(const TSourceLoc& loc, TOperator op, TIntermTyped* left,
                                             TIntermTyped* right)
{
    if (left == nullptr || right == nullptr)
        return nullptr;

    // writing to opaques will require fixing transforms
    if (left->getType().containsOpaque())
        intermediate.setNeedsLegalization();

    if (left->getAsOperator() && left->getAsOperator()->getOp() == EOpMatrixSwizzle)
        return handleAssignToMatrixSwizzle(loc, op, left, right);

    // Return true if the given node is an index operation into a split variable.
    const auto indexesSplit = [this](const TIntermTyped* node) -> bool {
        const TIntermBinary* binaryNode = node->getAsBinaryNode();

        if (binaryNode == nullptr)
            return false;

        return (binaryNode->getOp() == EOpIndexDirect || binaryNode->getOp() == EOpIndexIndirect) &&
               wasSplit(binaryNode->getLeft());
    };

    // Return symbol if node is symbol or index ref
    const auto getSymbol = [](const TIntermTyped* node) -> const TIntermSymbol* {
        const TIntermSymbol* symbolNode = node->getAsSymbolNode();
        if (symbolNode != nullptr)
            return symbolNode;

        const TIntermBinary* binaryNode = node->getAsBinaryNode();
        if (binaryNode != nullptr && (binaryNode->getOp() == EOpIndexDirect || binaryNode->getOp() == EOpIndexIndirect))
            return binaryNode->getLeft()->getAsSymbolNode();

        return nullptr;
    };

    // Return true if this stage assigns clip position with potentially inverted Y
    const auto assignsClipPos = [this](const TIntermTyped* node) -> bool {
        return node->getType().getQualifier().builtIn == EbvPosition &&
               (language == EShLangVertex || language == EShLangGeometry || language == EShLangTessEvaluation);
    };

    const TIntermSymbol* leftSymbol = getSymbol(left);
    const TIntermSymbol* rightSymbol = getSymbol(right);

    const bool isSplitLeft    = wasSplit(left) || indexesSplit(left);
    const bool isSplitRight   = wasSplit(right) || indexesSplit(right);

    const bool isFlattenLeft  = wasFlattened(leftSymbol);
    const bool isFlattenRight = wasFlattened(rightSymbol);

    // OK to do a single assign if neither side is split or flattened.  Otherwise,
    // fall through to a member-wise copy.
    if (!isFlattenLeft && !isFlattenRight && !isSplitLeft && !isSplitRight) {
        // Clip and cull distance requires more processing.  See comment above assignClipCullDistance.
        if (isClipOrCullDistance(left->getType()) || isClipOrCullDistance(right->getType())) {
            const bool isOutput = isClipOrCullDistance(left->getType());

            const int semanticId = (isOutput ? left : right)->getType().getQualifier().layoutLocation;
            return assignClipCullDistance(loc, op, semanticId, left, right);
        } else if (assignsClipPos(left)) {
            // Position can require special handling: see comment above assignPosition
            return assignPosition(loc, op, left, right);
        } else if (left->getQualifier().builtIn == EbvSampleMask) {
            // Certain builtins are required to be arrayed outputs in SPIR-V, but may internally be scalars
            // in the shader.  Copy the scalar RHS into the LHS array element zero, if that happens.
            if (left->isArray() && !right->isArray()) {
                const TType derefType(left->getType(), 0);
                left = intermediate.addIndex(EOpIndexDirect, left, intermediate.addConstantUnion(0, loc), loc);
                left->setType(derefType);
                // Fall through to add assign.
            }
        }

        return intermediate.addAssign(op, left, right, loc);
    }

    TIntermAggregate* assignList = nullptr;
    const TVector<TVariable*>* leftVariables = nullptr;
    const TVector<TVariable*>* rightVariables = nullptr;

    // A temporary to store the right node's value, so we don't keep indirecting into it
    // if it's not a simple symbol.
    TVariable* rhsTempVar = nullptr;

    // If the RHS is a simple symbol node, we'll copy it for each member.
    TIntermSymbol* cloneSymNode = nullptr;

    int memberCount = 0;

    // Track how many items there are to copy.
    if (left->getType().isStruct())
        memberCount = (int)left->getType().getStruct()->size();
    if (left->getType().isArray())
        memberCount = left->getType().getCumulativeArraySize();

    if (isFlattenLeft)
        leftVariables = &flattenMap.find(leftSymbol->getId())->second.members;

    if (isFlattenRight) {
        rightVariables = &flattenMap.find(rightSymbol->getId())->second.members;
    } else {
        // The RHS is not flattened.  There are several cases:
        // 1. 1 item to copy:  Use the RHS directly.
        // 2. >1 item, simple symbol RHS: we'll create a new TIntermSymbol node for each, but no assign to temp.
        // 3. >1 item, complex RHS: assign it to a new temp variable, and create a TIntermSymbol for each member.

        if (memberCount <= 1) {
            // case 1: we'll use the symbol directly below.  Nothing to do.
        } else {
            if (right->getAsSymbolNode() != nullptr) {
                // case 2: we'll copy the symbol per iteration below.
                cloneSymNode = right->getAsSymbolNode();
            } else {
                // case 3: assign to a temp, and indirect into that.
                rhsTempVar = makeInternalVariable("flattenTemp", right->getType());
                rhsTempVar->getWritableType().getQualifier().makeTemporary();
                TIntermTyped* noFlattenRHS = intermediate.addSymbol(*rhsTempVar, loc);

                // Add this to the aggregate being built.
                assignList = intermediate.growAggregate(assignList,
                                                        intermediate.addAssign(op, noFlattenRHS, right, loc), loc);
            }
        }
    }

    // When dealing with split arrayed structures of built-ins, the arrayness is moved to the extracted built-in
    // variables, which is awkward when copying between split and unsplit structures.  This variable tracks
    // array indirections so they can be percolated from outer structs to inner variables.
    std::vector <int> arrayElement;

    TStorageQualifier leftStorage = left->getType().getQualifier().storage;
    TStorageQualifier rightStorage = right->getType().getQualifier().storage;

    int leftOffsetStart = findSubtreeOffset(*left);
    int rightOffsetStart = findSubtreeOffset(*right);
    int leftOffset = leftOffsetStart;
    int rightOffset = rightOffsetStart;

    const auto getMember = [&](bool isLeft, const TType& type, int member, TIntermTyped* splitNode, int splitMember,
                               bool flattened)
                           -> TIntermTyped * {
        const bool split     = isLeft ? isSplitLeft   : isSplitRight;

        TIntermTyped* subTree;
        const TType derefType(type, member);
        const TVariable* builtInVar = nullptr;
        if ((flattened || split) && derefType.isBuiltIn()) {
            auto splitPair = splitBuiltIns.find(HlslParseContext::tInterstageIoData(
                                                   derefType.getQualifier().builtIn,
                                                   isLeft ? leftStorage : rightStorage));
            if (splitPair != splitBuiltIns.end())
                builtInVar = splitPair->second;
        }
        if (builtInVar != nullptr) {
            // copy from interstage IO built-in if needed
            subTree = intermediate.addSymbol(*builtInVar);

            if (subTree->getType().isArray()) {
                // Arrayness of builtIn symbols isn't handled by the normal recursion:
                // it's been extracted and moved to the built-in.
                if (!arrayElement.empty()) {
                    const TType splitDerefType(subTree->getType(), arrayElement.back());
                    subTree = intermediate.addIndex(EOpIndexDirect, subTree,
                                                    intermediate.addConstantUnion(arrayElement.back(), loc), loc);
                    subTree->setType(splitDerefType);
                } else if (splitNode->getAsOperator() != nullptr && (splitNode->getAsOperator()->getOp() == EOpIndexIndirect)) {
                    // This might also be a stage with arrayed outputs, in which case there's an index
                    // operation we should transfer to the output builtin.

                    const TType splitDerefType(subTree->getType(), 0);
                    subTree = intermediate.addIndex(splitNode->getAsOperator()->getOp(), subTree,
                                                    splitNode->getAsBinaryNode()->getRight(), loc);
                    subTree->setType(splitDerefType);
                }
            }
        } else if (flattened && !shouldFlatten(derefType, isLeft ? leftStorage : rightStorage, false)) {
            if (isLeft) {
                // offset will cycle through variables for arrayed io
                if (leftOffset >= static_cast<int>(leftVariables->size()))
                    leftOffset = leftOffsetStart;
                subTree = intermediate.addSymbol(*(*leftVariables)[leftOffset++]);
            } else {
                // offset will cycle through variables for arrayed io
                if (rightOffset >= static_cast<int>(rightVariables->size()))
                    rightOffset = rightOffsetStart;
                subTree = intermediate.addSymbol(*(*rightVariables)[rightOffset++]);
            }

            // arrayed io
            if (subTree->getType().isArray()) {
                if (!arrayElement.empty()) {
                    const TType derefType(subTree->getType(), arrayElement.front());
                    subTree = intermediate.addIndex(EOpIndexDirect, subTree,
                                                    intermediate.addConstantUnion(arrayElement.front(), loc), loc);
                    subTree->setType(derefType);
                } else {
                    // There's an index operation we should transfer to the output builtin.
                    assert(splitNode->getAsOperator() != nullptr &&
                           splitNode->getAsOperator()->getOp() == EOpIndexIndirect);
                    const TType splitDerefType(subTree->getType(), 0);
                    subTree = intermediate.addIndex(splitNode->getAsOperator()->getOp(), subTree,
                                                    splitNode->getAsBinaryNode()->getRight(), loc);
                    subTree->setType(splitDerefType);
                }
            }
        } else {
            // Index operator if it's an aggregate, else EOpNull
            const TOperator accessOp = type.isArray()  ? EOpIndexDirect
                                     : type.isStruct() ? EOpIndexDirectStruct
                                     : EOpNull;
            if (accessOp == EOpNull) {
                subTree = splitNode;
            } else {
                subTree = intermediate.addIndex(accessOp, splitNode, intermediate.addConstantUnion(splitMember, loc),
                                                loc);
                const TType splitDerefType(splitNode->getType(), splitMember);
                subTree->setType(splitDerefType);
            }
        }

        return subTree;
    };

    // Use the proper RHS node: a new symbol from a TVariable, copy
    // of an TIntermSymbol node, or sometimes the right node directly.
    right = rhsTempVar != nullptr   ? intermediate.addSymbol(*rhsTempVar, loc) :
            cloneSymNode != nullptr ? intermediate.addSymbol(*cloneSymNode) :
            right;

    // Cannot use auto here, because this is recursive, and auto can't work out the type without seeing the
    // whole thing.  So, we'll resort to an explicit type via std::function.
    const std::function<void(TIntermTyped* left, TIntermTyped* right, TIntermTyped* splitLeft, TIntermTyped* splitRight,
                             bool topLevel)>
    traverse = [&](TIntermTyped* left, TIntermTyped* right, TIntermTyped* splitLeft, TIntermTyped* splitRight,
                   bool topLevel) -> void {
        // If we get here, we are assigning to or from a whole array or struct that must be
        // flattened, so have to do member-by-member assignment:

        bool shouldFlattenSubsetLeft = isFlattenLeft && shouldFlatten(left->getType(), leftStorage, topLevel);
        bool shouldFlattenSubsetRight = isFlattenRight && shouldFlatten(right->getType(), rightStorage, topLevel);

        if ((left->getType().isArray() || right->getType().isArray()) &&
              (shouldFlattenSubsetLeft  || isSplitLeft ||
               shouldFlattenSubsetRight || isSplitRight)) {
            const int elementsL = left->getType().isArray()  ? left->getType().getOuterArraySize()  : 1;
            const int elementsR = right->getType().isArray() ? right->getType().getOuterArraySize() : 1;

            // The arrays might not be the same size,
            // e.g., if the size has been forced for EbvTessLevelInner/Outer.
            const int elementsToCopy = std::min(elementsL, elementsR);

            // array case
            for (int element = 0; element < elementsToCopy; ++element) {
                arrayElement.push_back(element);

                // Add a new AST symbol node if we have a temp variable holding a complex RHS.
                TIntermTyped* subLeft  = getMember(true,  left->getType(),  element, left, element,
                                                   shouldFlattenSubsetLeft);
                TIntermTyped* subRight = getMember(false, right->getType(), element, right, element,
                                                   shouldFlattenSubsetRight);

                TIntermTyped* subSplitLeft =  isSplitLeft  ? getMember(true,  left->getType(),  element, splitLeft,
                                                                       element, shouldFlattenSubsetLeft)
                                                           : subLeft;
                TIntermTyped* subSplitRight = isSplitRight ? getMember(false, right->getType(), element, splitRight,
                                                                       element, shouldFlattenSubsetRight)
                                                           : subRight;

                traverse(subLeft, subRight, subSplitLeft, subSplitRight, false);

                arrayElement.pop_back();
            }
        } else if (left->getType().isStruct() && (shouldFlattenSubsetLeft  || isSplitLeft ||
                                                  shouldFlattenSubsetRight || isSplitRight)) {
            // struct case
            const auto& membersL = *left->getType().getStruct();
            const auto& membersR = *right->getType().getStruct();

            // These track the members in the split structures corresponding to the same in the unsplit structures,
            // which we traverse in parallel.
            int memberL = 0;
            int memberR = 0;

            // Handle empty structure assignment
            if (int(membersL.size()) == 0 && int(membersR.size()) == 0)
                assignList = intermediate.growAggregate(assignList, intermediate.addAssign(op, left, right, loc), loc);

            for (int member = 0; member < int(membersL.size()); ++member) {
                const TType& typeL = *membersL[member].type;
                const TType& typeR = *membersR[member].type;

                TIntermTyped* subLeft  = getMember(true,  left->getType(), member, left, member,
                                                   shouldFlattenSubsetLeft);
                TIntermTyped* subRight = getMember(false, right->getType(), member, right, member,
                                                   shouldFlattenSubsetRight);

                // If there is no splitting, use the same values to avoid inefficiency.
                TIntermTyped* subSplitLeft =  isSplitLeft  ? getMember(true,  left->getType(),  member, splitLeft,
                                                                       memberL, shouldFlattenSubsetLeft)
                                                           : subLeft;
                TIntermTyped* subSplitRight = isSplitRight ? getMember(false, right->getType(), member, splitRight,
                                                                       memberR, shouldFlattenSubsetRight)
                                                           : subRight;

                if (isClipOrCullDistance(subSplitLeft->getType()) || isClipOrCullDistance(subSplitRight->getType())) {
                    // Clip and cull distance built-in assignment is complex in its own right, and is handled in
                    // a separate function dedicated to that task.  See comment above assignClipCullDistance;

                    const bool isOutput = isClipOrCullDistance(subSplitLeft->getType());

                    // Since all clip/cull semantics boil down to the same built-in type, we need to get the
                    // semantic ID from the dereferenced type's layout location, to avoid an N-1 mapping.
                    const TType derefType((isOutput ? left : right)->getType(), member);
                    const int semanticId = derefType.getQualifier().layoutLocation;

                    TIntermAggregate* clipCullAssign = assignClipCullDistance(loc, op, semanticId,
                                                                              subSplitLeft, subSplitRight);

                    assignList = intermediate.growAggregate(assignList, clipCullAssign, loc);
                } else if (subSplitRight->getType().getQualifier().builtIn == EbvFragCoord) {
                    // FragCoord can require special handling: see comment above assignFromFragCoord
                    TIntermTyped* fragCoordAssign = assignFromFragCoord(loc, op, subSplitLeft, subSplitRight);
                    assignList = intermediate.growAggregate(assignList, fragCoordAssign, loc);
                } else if (assignsClipPos(subSplitLeft)) {
                    // Position can require special handling: see comment above assignPosition
                    TIntermTyped* positionAssign = assignPosition(loc, op, subSplitLeft, subSplitRight);
                    assignList = intermediate.growAggregate(assignList, positionAssign, loc);
                } else if (!shouldFlattenSubsetLeft && !shouldFlattenSubsetRight &&
                           !typeL.containsBuiltIn() && !typeR.containsBuiltIn()) {
                    // If this is the final flattening (no nested types below to flatten)
                    // we'll copy the member, else recurse into the type hierarchy.
                    // However, if splitting the struct, that means we can copy a whole
                    // subtree here IFF it does not itself contain any interstage built-in
                    // IO variables, so we only have to recurse into it if there's something
                    // for splitting to do.  That can save a lot of AST verbosity for
                    // a bunch of memberwise copies.

                    assignList = intermediate.growAggregate(assignList,
                                                            intermediate.addAssign(op, subSplitLeft, subSplitRight, loc),
                                                            loc);
                } else {
                    traverse(subLeft, subRight, subSplitLeft, subSplitRight, false);
                }

                memberL += (typeL.isBuiltIn() ? 0 : 1);
                memberR += (typeR.isBuiltIn() ? 0 : 1);
            }
        } else {
            // Member copy
            assignList = intermediate.growAggregate(assignList, intermediate.addAssign(op, left, right, loc), loc);
        }

    };

    TIntermTyped* splitLeft  = left;
    TIntermTyped* splitRight = right;

    // If either left or right was a split structure, we must read or write it, but still have to
    // parallel-recurse through the unsplit structure to identify the built-in IO vars.
    // The left can be either a symbol, or an index into a symbol (e.g, array reference)
    if (isSplitLeft) {
        if (indexesSplit(left)) {
            // Index case: Refer to the indexed symbol, if the left is an index operator.
            const TIntermSymbol* symNode = left->getAsBinaryNode()->getLeft()->getAsSymbolNode();

            TIntermTyped* splitLeftNonIo = intermediate.addSymbol(*getSplitNonIoVar(symNode->getId()), loc);

            splitLeft = intermediate.addIndex(left->getAsBinaryNode()->getOp(), splitLeftNonIo,
                                              left->getAsBinaryNode()->getRight(), loc);

            const TType derefType(splitLeftNonIo->getType(), 0);
            splitLeft->setType(derefType);
        } else {
            // Symbol case: otherwise, if not indexed, we have the symbol directly.
            const TIntermSymbol* symNode = left->getAsSymbolNode();
            splitLeft = intermediate.addSymbol(*getSplitNonIoVar(symNode->getId()), loc);
        }
    }

    if (isSplitRight)
        splitRight = intermediate.addSymbol(*getSplitNonIoVar(right->getAsSymbolNode()->getId()), loc);

    // This makes the whole assignment, recursing through subtypes as needed.
    traverse(left, right, splitLeft, splitRight, true);

    assert(assignList != nullptr);
    assignList->setOperator(EOpSequence);

    return assignList;
}